

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *pGVar3;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar4;
  undefined4 extraout_var_00;
  GetFloatVerifier *pGVar5;
  undefined4 extraout_var_01;
  long *plVar6;
  ApiCase *pAVar7;
  long *plVar8;
  long lVar9;
  StateVerifier *verifiers [3];
  long *local_90;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  ApiCase *local_50;
  GetBooleanVerifier *local_48;
  GetIntegerVerifier *local_40;
  GetFloatVerifier *local_38;
  
  pGVar3 = (GetBooleanVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar3->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar3->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar3->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar3->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216b390;
  this->m_verifierBoolean = pGVar3;
  pGVar4 = (GetIntegerVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar4->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar4->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar4->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar4->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216b3d8;
  this->m_verifierInteger = pGVar4;
  pGVar5 = (GetFloatVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar5->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0216b468;
  this->m_verifierFloat = pGVar5;
  local_48 = this->m_verifierBoolean;
  local_40 = this->m_verifierInteger;
  local_38 = pGVar5;
  lVar9 = 0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[lVar9];
    local_50 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"depth_range","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    pAVar7 = local_50;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(local_50,pCVar1,(char *)local_90,"DEPTH_RANGE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b588;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"line_width","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"LINE_WIDTH");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b5e0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"polygon_offset_factor","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"POLYGON_OFFSET_FACTOR");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b638;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"polygon_offset_units","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"POLYGON_OFFSET_UNITS");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b690;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sample_coverage_value","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"SAMPLE_COVERAGE_VALUE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b6e8;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"color_clear_value","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"COLOR_CLEAR_VALUE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b740;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"depth_clear_value","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"DEPTH_CLEAR_VALUE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b798;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"aliased_point_size_range","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"ALIASED_POINT_SIZE_RANGE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b7f0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  local_50 = (ApiCase *)0x0;
  do {
    local_90 = &local_80;
    pGVar3 = (&local_48)[(long)local_50];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"aliased_line_width_range","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ApiCase::ApiCase(pAVar7,pCVar1,(char *)local_90,"ALIASED_LINE_WIDTH_RANGE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0216b848;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar7);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_50 = (ApiCase *)((long)local_50 + 1);
  } while (local_50 != (ApiCase *)0x3);
  return 3;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}